

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simpleformatter.cpp
# Opt level: O0

UnicodeString *
icu_63::SimpleFormatter::getTextWithNoArguments
          (UnicodeString *__return_storage_ptr__,UChar *compiledPattern,
          int32_t compiledPatternLength)

{
  int32_t iVar1;
  int iVar2;
  ConstChar16Ptr local_38;
  int32_t local_2c;
  int local_28;
  int32_t segmentLength;
  int32_t i;
  int32_t local_1c;
  int32_t capacity;
  int32_t compiledPatternLength_local;
  UChar *compiledPattern_local;
  UnicodeString *sb;
  
  local_1c = compiledPatternLength;
  _capacity = compiledPattern;
  compiledPattern_local = (UChar *)__return_storage_ptr__;
  iVar1 = getArgumentLimit(compiledPattern,compiledPatternLength);
  i = (compiledPatternLength + -1) - iVar1;
  segmentLength._3_1_ = 0;
  UnicodeString::UnicodeString(__return_storage_ptr__,i,0,0);
  local_28 = 1;
  while (local_28 < local_1c) {
    iVar2 = local_28 + 1;
    local_2c = (ushort)_capacity[local_28] - 0x100;
    local_28 = iVar2;
    if (0 < local_2c) {
      ConstChar16Ptr::ConstChar16Ptr(&local_38,_capacity + iVar2);
      UnicodeString::append(__return_storage_ptr__,&local_38,local_2c);
      ConstChar16Ptr::~ConstChar16Ptr(&local_38);
      local_28 = local_2c + local_28;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

UnicodeString SimpleFormatter::getTextWithNoArguments(
        const UChar *compiledPattern, int32_t compiledPatternLength) {
    int32_t capacity = compiledPatternLength - 1 -
            getArgumentLimit(compiledPattern, compiledPatternLength);
    UnicodeString sb(capacity, 0, 0);  // Java: StringBuilder
    for (int32_t i = 1; i < compiledPatternLength;) {
        int32_t segmentLength = compiledPattern[i++] - ARG_NUM_LIMIT;
        if (segmentLength > 0) {
            sb.append(compiledPattern + i, segmentLength);
            i += segmentLength;
        }
    }
    return sb;
}